

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE xio;
  SOCKETIO_CONFIG socketio_config;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    io_interface_description = socketio_get_interface_description();
    if (io_interface_description == (IO_INTERFACE_DESCRIPTION *)0x0) {
      printf("Error getting socketio interface description.");
      iVar1 = 0x45;
    }
    else {
      socketio_config.hostname = "www.google.com";
      socketio_config.port = 0x50;
      xio = xio_create(io_interface_description,&socketio_config);
      if (xio == (XIO_HANDLE)0x0) {
        printf("Error creating socket IO.");
        iVar1 = 0x52;
      }
      else {
        iVar1 = xio_open(xio,on_io_open_complete,xio,on_io_bytes_received,xio,on_io_error,xio);
        if (iVar1 == 0) {
          do {
            xio_dowork(xio);
          } while( true );
        }
        printf("Error opening socket IO.");
        xio_destroy(xio);
        iVar1 = 0x59;
      }
    }
    platform_deinit();
  }
  else {
    printf("Cannot initialize platform.");
    iVar1 = 0x3d;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    (void)argc, (void)argv;

    if (platform_init() != 0)
    {
        (void)printf("Cannot initialize platform.");
        result = MU_FAILURE;
    }
    else
    {
        const IO_INTERFACE_DESCRIPTION* socketio_interface = socketio_get_interface_description();
        if (socketio_interface == NULL)
        {
            (void)printf("Error getting socketio interface description.");
            result = MU_FAILURE;
        }
        else
        {
            SOCKETIO_CONFIG socketio_config;
            XIO_HANDLE socketio;

            socketio_config.hostname = "www.google.com";
            socketio_config.port = 80;
            socketio = xio_create(socketio_interface, &socketio_config);
            if (socketio == NULL)
            {
                (void)printf("Error creating socket IO.");
                result = MU_FAILURE;
            }
            else
            {
                if (xio_open(socketio, on_io_open_complete, socketio, on_io_bytes_received, socketio, on_io_error, socketio) != 0)
                {
                    (void)printf("Error opening socket IO.");
                    result = MU_FAILURE;
                }
                else
                {
                    unsigned char done = 0;
                    while (!done)
                    {
                        xio_dowork(socketio);
                    }

                    result = 0;
                }

                xio_destroy(socketio);
            }
        }

        platform_deinit();
    }

    return result;
}